

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O3

QPair<int,_QPair<bool,_bool>_> scanDelims(QString *text,int start,bool canSplitWord)

{
  uint uVar1;
  char16_t *pcVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  byte bVar8;
  wchar32 wVar9;
  byte bVar10;
  char16_t *pcVar11;
  byte bVar12;
  char16_t cVar13;
  uint uVar14;
  uint uVar15;
  QPair<int,_QPair<bool,_bool>_> QVar17;
  ulong uVar18;
  ulong uVar16;
  
  uVar16 = (ulong)(uint)start;
  uVar1 = (uint)(text->d).size;
  pcVar2 = (text->d).ptr;
  if (start < 1) {
    uVar18 = 0;
  }
  else {
    uVar18 = (ulong)(ushort)pcVar2[uVar16 - 1];
  }
  uVar15 = start;
  if (start < (int)uVar1) {
    pcVar11 = pcVar2 + start;
    cVar13 = *pcVar11;
    do {
      uVar15 = (uint)uVar16;
      if (*pcVar11 != cVar13) break;
      uVar14 = (uint)uVar16 + 1;
      uVar16 = (ulong)uVar14;
      pcVar11 = pcVar11 + 1;
      uVar15 = uVar1;
    } while (uVar1 != uVar14);
  }
  cVar13 = L'\0';
  if ((int)(uVar15 + 1) < (int)uVar1) {
    cVar13 = pcVar2[(int)uVar15];
  }
  wVar9 = (wchar32)uVar18;
  iVar7 = (int)(char)uVar18;
  if (0xff < (uint)wVar9) {
    iVar7 = 0;
  }
  bVar3 = 1;
  if (0xe < iVar7 - 0x21U) {
    if (iVar7 - 0x3aU < 0x27) {
      if (3 < iVar7 - 0x7bU && (0x7e0000007fU >> ((byte)(iVar7 - 0x3aU) & 0x3f) & 1) == 0) {
LAB_00127784:
        bVar3 = QChar::isPunct(wVar9);
      }
    }
    else if (3 < iVar7 - 0x7bU) goto LAB_00127784;
  }
  bVar4 = 1;
  iVar7 = (int)(char)cVar13;
  if (0xff < (ushort)cVar13) {
    iVar7 = 0;
  }
  if (0xe < iVar7 - 0x21U) {
    if (iVar7 - 0x3aU < 0x27) {
      if (3 < iVar7 - 0x7bU && (0x7e0000007fU >> ((byte)(iVar7 - 0x3aU) & 0x3f) & 1) == 0) {
LAB_001277e0:
        bVar4 = QChar::isPunct((uint)(ushort)cVar13);
      }
    }
    else if (3 < iVar7 - 0x7bU) goto LAB_001277e0;
  }
  if ((0x20 < (ushort)uVar18) || (bVar5 = 1, (0x100003e01U >> (uVar18 & 0x3f) & 1) == 0)) {
    if ((uint)wVar9 < 0x80) {
      bVar5 = 0;
    }
    else {
      bVar5 = 1;
      if ((wVar9 != L'\x85') && (wVar9 != L'\xa0')) {
        bVar5 = QChar::isSpace_helper(wVar9);
      }
    }
  }
  if (((ushort)cVar13 < 0x21) && ((0x100003e01U >> ((ulong)(ushort)cVar13 & 0x3f) & 1) != 0)) {
    bVar6 = 1;
    bVar8 = 0;
    goto LAB_001278da;
  }
  if ((ushort)cVar13 < 0x80) {
    if (bVar4 != 0) goto LAB_001278c7;
    bVar8 = 1;
  }
  else {
    bVar6 = 1;
    bVar8 = 0;
    wVar9 = (wchar32)(ushort)cVar13;
    if ((wVar9 == L'\x85') || (wVar9 == L'\xa0')) goto LAB_001278da;
    bVar6 = QChar::isSpace_helper(wVar9);
    if (bVar4 != 1 || bVar6 != 0) {
      bVar8 = bVar6 ^ 1;
      goto LAB_001278da;
    }
LAB_001278c7:
    bVar8 = bVar5 | bVar3 | bVar4 ^ 1;
  }
  bVar6 = 0;
LAB_001278da:
  bVar10 = bVar5 ^ 1;
  bVar12 = bVar4;
  if (bVar3 == 0) {
    bVar12 = bVar10;
  }
  if (bVar6 != 0) {
    bVar12 = bVar10;
  }
  if (bVar5 != 0) {
    bVar12 = bVar10;
  }
  bVar4 = bVar8 ^ 1 | bVar4;
  bVar3 = ~bVar12 | bVar3;
  if (canSplitWord) {
    bVar4 = bVar12 & canSplitWord;
    bVar3 = bVar8 & canSplitWord;
  }
  if (bVar8 == 0) {
    bVar3 = bVar8 & canSplitWord;
  }
  QVar17.first = uVar15 - start;
  if (bVar12 == 0) {
    bVar4 = bVar12 & canSplitWord;
  }
  QVar17._4_4_ = bVar3 & 1 | (uint)bVar4 << 8;
  return QVar17;
}

Assistant:

QPair<int, QPair<bool, bool>> scanDelims(const QString &text, const int start,
                                         const bool canSplitWord) {
    int pos = start;
    const int textLen = text.length();
    const QChar marker = text.at(start);
    bool leftFlanking = true;
    bool rightFlanking = true;

    const QChar lastChar = start > 0 ? text.at(start - 1) : QChar('\0');

    while (pos < textLen && text.at(pos) == marker) ++pos;
    const int length = pos - start;

    const QChar nextChar = pos + 1 < textLen ? text.at(pos) : QChar('\0');

    const bool isLastPunct =
        isMDAsciiPunct(lastChar.toLatin1()) || lastChar.isPunct();
    const bool isNextPunct =
        isMDAsciiPunct(nextChar.toLatin1()) || nextChar.isPunct();
    // treat line end and start as whitespace
    const bool isLastWhiteSpace = lastChar.isNull() ? true : lastChar.isSpace();
    const bool isNextWhiteSpace = nextChar.isNull() ? true : nextChar.isSpace();

    if (isNextWhiteSpace) {
        leftFlanking = false;
    } else if (isNextPunct) {
        if (!(isLastWhiteSpace || isLastPunct)) leftFlanking = false;
    }

    if (isLastWhiteSpace) {
        rightFlanking = false;
    } else if (isLastPunct) {
        if (!(isNextWhiteSpace || isNextPunct)) rightFlanking = false;
    }

    //    qDebug () << isNextWhiteSpace << marker;
    //    qDebug () << text << leftFlanking << rightFlanking << lastChar <<
    //    nextChar;

    const bool canOpen = canSplitWord
                             ? leftFlanking
                             : leftFlanking && (!rightFlanking || isLastPunct);
    const bool canClose = canSplitWord
                              ? rightFlanking
                              : rightFlanking && (!leftFlanking || isNextPunct);

    return QPair<int, QPair<bool, bool>>{length, {canOpen, canClose}};
}